

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

Var Js::GlobalObject::EntryParseFloat(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  Var aValue;
  CharClassifier *this;
  undefined4 extraout_var;
  double value;
  CallInfo value_00;
  int in_stack_00000010;
  OLECHAR *local_58;
  char16 *pch;
  CallInfo callInfo_local;
  JavascriptString *local_40;
  undefined1 local_38 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pch = (char16 *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x4b6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a25ecd;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_38,(CallInfo *)&pch,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)pch & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x4b9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a25ecd;
    *puVar6 = 0;
  }
  if ((local_38._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x4bb,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00a25ecd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  EnterPinnedScope(&local_40);
  if ((local_38._0_4_ & 0xfffffe) == 0) {
    value_00 = (CallInfo)NAN;
  }
  else {
    pvVar7 = Arguments::operator[]((Arguments *)local_38,1);
    bVar3 = TaggedInt::Is(pvVar7);
    pvVar7 = Arguments::operator[]((Arguments *)local_38,1);
    if (bVar3) {
      return pvVar7;
    }
    aValue = Arguments::operator[]((Arguments *)local_38,1);
    if ((ulong)pvVar7 >> 0x32 != 0) {
      value = JavascriptNumber::GetValue(aValue);
      BVar4 = JavascriptNumber::IsNegZero(value);
      if (BVar4 == 0) {
        pvVar7 = Arguments::operator[]((Arguments *)local_38,1);
        return pvVar7;
      }
      return &DAT_1000000000000;
    }
    bVar3 = VarIs<Js::JavascriptString>(aValue);
    pvVar7 = Arguments::operator[]((Arguments *)local_38,1);
    if (bVar3) {
      local_40 = VarTo<Js::JavascriptString>(pvVar7);
    }
    else {
      local_40 = JavascriptConversion::ToString(pvVar7,pSVar1);
    }
    this = ScriptContext::GetCharClassifier(pSVar1);
    iVar5 = (*(local_40->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    local_58 = CharClassifier::SkipWhiteSpace(this,(LPCOLESTR)CONCAT44(extraout_var,iVar5));
    callInfo_local = (CallInfo)NumberUtilities::StrToDbl<char16_t>(local_58,&local_58,pSVar1);
    LeavePinnedScope();
    value_00 = callInfo_local;
  }
  pvVar7 = JavascriptNumber::ToVarNoCheck((double)value_00,pSVar1);
  return pvVar7;
}

Assistant:

Var GlobalObject::EntryParseFloat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        double result = 0;
        ENTER_PINNED_SCOPE(JavascriptString, str);

        if(args.Info.Count < 2)
        {
            // We're really converting "undefined" here, but "undefined" produces
            // NaN, so just return that directly.
            return JavascriptNumber::ToVarNoCheck(JavascriptNumber::NaN, scriptContext);
        }

        // Short cut for numbers
        if (TaggedInt::Is(args[1]))
        {
            return args[1];
        }
        if(JavascriptNumber::Is_NoTaggedIntCheck(args[1]))
        {
            // If the value is negative zero, return positive zero. Since the parameter type is string, -0 would first be
            // converted to the string "0", then parsed to result in positive zero.
            return
                JavascriptNumber::IsNegZero(JavascriptNumber::GetValue(args[1])) ?
                    TaggedInt::ToVarUnchecked(0) :
                    args[1];
        }

        // convert input to a string
        if (VarIs<JavascriptString>(args[1]))
        {
            str = VarTo<JavascriptString>(args[1]);
        }
        else
        {
            str = JavascriptConversion::ToString(args[1], scriptContext);
        }

        // skip preceding whitespace
        const char16 *pch = scriptContext->GetCharClassifier()->SkipWhiteSpace(str->GetSz());

        // perform the string -> float conversion
        result = NumberUtilities::StrToDbl(pch, &pch, scriptContext);
        LEAVE_PINNED_SCOPE();   // str

        return JavascriptNumber::ToVarNoCheck(result, scriptContext);
    }